

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2-impl.h
# Opt level: O0

void store64(void *dst,uint64_t w)

{
  uint64_t w_local;
  void *dst_local;
  
  *(uint64_t *)dst = w;
  return;
}

Assistant:

static inline void store64(void *dst, uint64_t w) {
#if defined(NATIVE_LITTLE_ENDIAN)
    *(uint64_t *)dst = w;
#else
    uint8_t *p = (uint8_t *)dst;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
    w >>= 8;
    *p++ = (uint8_t)w;
#endif
}